

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O0

void extraProfileUpdateTopLevel(st__table *tNodeTopRef,int TopLevelNew,DdNode *node)

{
  int iVar1;
  char **local_28;
  int *pTopLevel;
  DdNode *node_local;
  st__table *psStack_10;
  int TopLevelNew_local;
  st__table *tNodeTopRef_local;
  
  pTopLevel = (int *)node;
  node_local._4_4_ = TopLevelNew;
  psStack_10 = tNodeTopRef;
  iVar1 = st__find_or_add(tNodeTopRef,(char *)node,&local_28);
  if (iVar1 == 0) {
    *(int *)local_28 = node_local._4_4_;
  }
  else if (node_local._4_4_ < *(int *)local_28) {
    *(int *)local_28 = node_local._4_4_;
  }
  return;
}

Assistant:

void extraProfileUpdateTopLevel( st__table * tNodeTopRef, int TopLevelNew, DdNode * node )
{
    int * pTopLevel;

    if ( st__find_or_add( tNodeTopRef, (char*)node, (char***)&pTopLevel ) )
    { // the node is already referenced
        // the current top level should be updated if it is larger than the new level
        if ( *pTopLevel > TopLevelNew ) 
             *pTopLevel = TopLevelNew;
    }
    else
    { // the node is not referenced
        // its level should be set to the current new level
        *pTopLevel = TopLevelNew;
    }
}